

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_exp_mod(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *E,mbedtls_mpi *N,mbedtls_mpi *_RR
                       )

{
  mbedtls_mpi *X_00;
  mbedtls_mpi_uint *pmVar1;
  bool bVar2;
  sbyte sVar3;
  int iVar4;
  mbedtls_mpi_uint m0;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  mbedtls_mpi_uint mVar9;
  ulong uVar10;
  mbedtls_mpi *pmVar11;
  long lVar12;
  long lVar13;
  mbedtls_mpi RR;
  mbedtls_mpi_uint z;
  mbedtls_mpi Apos;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi W [128];
  ulong local_cd8;
  long local_cc8;
  ulong local_cc0;
  mbedtls_mpi local_cb0;
  mbedtls_mpi local_c98;
  int local_c74;
  mbedtls_mpi_uint local_c70;
  mbedtls_mpi local_c68;
  mbedtls_mpi local_c50;
  mbedtls_mpi local_c38;
  mbedtls_mpi local_c20 [127];
  
  local_c50.s = 0;
  local_c50._4_4_ = 0;
  local_c38.s = 1;
  local_c38.n = 1;
  local_c38.p = (mbedtls_mpi_uint *)&local_c50;
  iVar4 = mbedtls_mpi_cmp_mpi(N,&local_c38);
  if (iVar4 < 1) {
    return -4;
  }
  pmVar1 = N->p;
  if ((*pmVar1 & 1) == 0) {
    return -4;
  }
  local_c50.s = 0;
  local_c50._4_4_ = 0;
  local_c38.s = 1;
  local_c38.n = 1;
  local_c38.p = (mbedtls_mpi_uint *)&local_c50;
  iVar4 = mbedtls_mpi_cmp_mpi(E,&local_c38);
  if (iVar4 < 0) {
    return -4;
  }
  mVar9 = *pmVar1;
  lVar8 = ((int)mVar9 * 2 + 4U & 8) + mVar9;
  uVar6 = 0x40;
  do {
    lVar8 = (2 - lVar8 * mVar9) * lVar8;
    bVar2 = 0xf < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar2);
  local_c98.s = 1;
  local_c98.n = 0;
  local_c98.p = (mbedtls_mpi_uint *)0x0;
  local_cb0.s = 1;
  local_cb0.n = 0;
  local_cb0.p = (mbedtls_mpi_uint *)0x0;
  local_c68.s = 1;
  local_c68.n = 0;
  local_c68.p = (mbedtls_mpi_uint *)0x0;
  memset(&local_c38,0,0xc00);
  sVar5 = mbedtls_mpi_bitlen(E);
  lVar13 = 6;
  if (((sVar5 < 0x2a0) && (lVar13 = 5, sVar5 < 0xf0)) && (lVar13 = 4, sVar5 < 0x50)) {
    lVar13 = (ulong)(0x17 < sVar5) * 2 + 1;
  }
  sVar5 = N->n + 1;
  iVar4 = mbedtls_mpi_grow(X,sVar5);
  sVar3 = (sbyte)lVar13;
  if (((iVar4 == 0) && (iVar4 = mbedtls_mpi_grow(local_c20,sVar5), iVar4 == 0)) &&
     (iVar4 = mbedtls_mpi_grow(&local_cb0,sVar5 * 2), iVar4 == 0)) {
    local_c74 = A->s;
    if (local_c74 == -1) {
      iVar4 = mbedtls_mpi_copy(&local_c68,A);
      if (iVar4 != 0) goto LAB_00110c38;
      local_c68.s = 1;
      A = &local_c68;
    }
    if ((_RR == (mbedtls_mpi *)0x0) || (_RR->p == (mbedtls_mpi_uint *)0x0)) {
      iVar4 = mbedtls_mpi_lset(&local_c98,1);
      if ((iVar4 != 0) ||
         ((iVar4 = mbedtls_mpi_shift_l(&local_c98,N->n << 7), iVar4 != 0 ||
          (iVar4 = mbedtls_mpi_mod_mpi(&local_c98,&local_c98,N), iVar4 != 0)))) goto LAB_00110c38;
      if (_RR != (mbedtls_mpi *)0x0) {
        _RR->p = local_c98.p;
        _RR->s = local_c98.s;
        *(undefined4 *)&_RR->field_0x4 = local_c98._4_4_;
        _RR->n = local_c98.n;
      }
    }
    else {
      local_c98.p = _RR->p;
      local_c98.s = _RR->s;
      local_c98._4_4_ = *(undefined4 *)&_RR->field_0x4;
      local_c98.n = _RR->n;
    }
    iVar4 = mbedtls_mpi_cmp_mpi(A,N);
    if (iVar4 < 0) {
      iVar4 = mbedtls_mpi_copy(local_c20,A);
    }
    else {
      iVar4 = mbedtls_mpi_mod_mpi(local_c20,A,N);
    }
    if (iVar4 == 0) {
      mVar9 = -lVar8;
      iVar4 = mpi_montmul(local_c20,&local_c98,N,mVar9,&local_cb0);
      if ((iVar4 == 0) && (iVar4 = mbedtls_mpi_copy(X,&local_c98), iVar4 == 0)) {
        local_c50.p = &local_c70;
        local_c70 = 1;
        local_c50.s = 1;
        local_c50.n = 1;
        iVar4 = mpi_montmul(X,&local_c50,N,mVar9,&local_cb0);
        if (iVar4 == 0) {
          if ((uint)lVar13 < 2) {
LAB_00111004:
            sVar5 = E->n;
            local_cc0 = 0;
            uVar10 = 0;
            local_cc8 = 0;
            lVar8 = 0;
            do {
              while( true ) {
                do {
                  lVar12 = lVar8;
                  if (uVar10 == 0) {
                    if (sVar5 == 0) {
                      if (local_cc8 == 0) goto LAB_001111bf;
                      goto LAB_00111165;
                    }
                    sVar5 = sVar5 - 1;
                    uVar10 = 0x40;
                  }
                  uVar10 = uVar10 - 1;
                  uVar7 = (ulong)((E->p[sVar5] >> (uVar10 & 0x3f) & 1) != 0);
                  lVar8 = 0;
                } while (uVar7 == 0 && lVar12 == 0);
                if ((lVar12 == 1) && (uVar7 == 0)) break;
                local_cc8 = local_cc8 + 1;
                local_cc0 = local_cc0 | uVar7 << (sVar3 - (char)local_cc8 & 0x3fU);
                lVar8 = 2;
                lVar12 = lVar13;
                if (lVar13 == local_cc8) {
                  do {
                    iVar4 = mpi_montmul(X,X,N,mVar9,&local_cb0);
                    if (iVar4 != 0) goto LAB_00110c38;
                    lVar12 = lVar12 + -1;
                  } while (lVar12 != 0);
                  iVar4 = mpi_montmul(X,&local_c38 + local_cc0,N,mVar9,&local_cb0);
                  local_cc0 = 0;
                  local_cc8 = 0;
                  lVar8 = 1;
                  if (iVar4 != 0) goto LAB_00110c38;
                }
              }
              iVar4 = mpi_montmul(X,X,N,mVar9,&local_cb0);
              lVar8 = 1;
            } while (iVar4 == 0);
          }
          else {
            local_cd8 = 1L << (sVar3 - 1U & 0x3f);
            pmVar11 = &local_c38 + local_cd8;
            iVar4 = mbedtls_mpi_grow(pmVar11,N->n + 1);
            if ((iVar4 == 0) && (iVar4 = mbedtls_mpi_copy(pmVar11,local_c20), iVar4 == 0)) {
              lVar8 = 1;
              do {
                iVar4 = mpi_montmul(pmVar11,pmVar11,N,mVar9,&local_cb0);
                if (iVar4 != 0) goto LAB_00110c38;
                lVar8 = lVar8 + 1;
              } while (lVar13 != lVar8);
              do {
                local_cd8 = local_cd8 + 1;
                if (local_cd8 >> sVar3 != 0) goto LAB_00111004;
                X_00 = pmVar11 + 1;
                iVar4 = mbedtls_mpi_grow(X_00,N->n + 1);
              } while (((iVar4 == 0) && (iVar4 = mbedtls_mpi_copy(X_00,pmVar11), iVar4 == 0)) &&
                      (iVar4 = mpi_montmul(X_00,local_c20,N,mVar9,&local_cb0), pmVar11 = X_00,
                      iVar4 == 0));
            }
          }
        }
      }
    }
  }
  goto LAB_00110c38;
  while (local_cc8 = local_cc8 + -1, local_cc8 != 0) {
LAB_00111165:
    iVar4 = mpi_montmul(X,X,N,mVar9,&local_cb0);
    if ((iVar4 != 0) ||
       ((local_cc0 = local_cc0 * 2, ((uint)local_cc0 & (uint)(1L << sVar3)) != 0 &&
        (iVar4 = mpi_montmul(X,local_c20,N,mVar9,&local_cb0), iVar4 != 0)))) goto LAB_00110c38;
  }
LAB_001111bf:
  local_c70 = 1;
  local_c50.s = 1;
  local_c50.n = 1;
  local_c50.p = &local_c70;
  iVar4 = mpi_montmul(X,&local_c50,N,mVar9,&local_cb0);
  if (((local_c74 == -1) && (iVar4 == 0)) && ((iVar4 = 0, E->n != 0 && ((*E->p & 1) != 0)))) {
    X->s = -1;
    iVar4 = mbedtls_mpi_add_mpi(X,N,X);
  }
LAB_00110c38:
  uVar10 = 1L << (sVar3 - 1U & 0x3f);
  if (uVar10 >> sVar3 == 0) {
    pmVar11 = &local_c38 + uVar10;
    do {
      uVar10 = uVar10 + 1;
      mbedtls_mpi_free(pmVar11);
      pmVar11 = pmVar11 + 1;
    } while (uVar10 >> sVar3 == 0);
  }
  if (local_c20[0].p != (mbedtls_mpi_uint *)0x0) {
    if (local_c20[0].n != 0) {
      sVar5 = 0;
      do {
        local_c20[0].p[sVar5] = 0;
        sVar5 = sVar5 + 1;
      } while (local_c20[0].n != sVar5);
    }
    free(local_c20[0].p);
  }
  local_c20[0].s = 1;
  local_c20[0].n = 0;
  local_c20[0].p = (mbedtls_mpi_uint *)0x0;
  if (local_cb0.p != (mbedtls_mpi_uint *)0x0) {
    if (local_cb0.n != 0) {
      sVar5 = 0;
      do {
        local_cb0.p[sVar5] = 0;
        sVar5 = sVar5 + 1;
      } while (local_cb0.n != sVar5);
    }
    free(local_cb0.p);
  }
  if (local_c68.p != (mbedtls_mpi_uint *)0x0) {
    if (local_c68.n != 0) {
      sVar5 = 0;
      do {
        local_c68.p[sVar5] = 0;
        sVar5 = sVar5 + 1;
      } while (local_c68.n != sVar5);
    }
    free(local_c68.p);
  }
  local_c68.s = 1;
  local_c68.n = 0;
  local_c68.p = (mbedtls_mpi_uint *)0x0;
  if (((_RR == (mbedtls_mpi *)0x0) || (_RR->p == (mbedtls_mpi_uint *)0x0)) &&
     (local_c98.p != (mbedtls_mpi_uint *)0x0)) {
    if (local_c98.n != 0) {
      sVar5 = 0;
      do {
        local_c98.p[sVar5] = 0;
        sVar5 = sVar5 + 1;
      } while (local_c98.n != sVar5);
    }
    free(local_c98.p);
  }
  return iVar4;
}

Assistant:

int mbedtls_mpi_exp_mod( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *E, const mbedtls_mpi *N, mbedtls_mpi *_RR )
{
    int ret;
    size_t wbits, wsize, one = 1;
    size_t i, j, nblimbs;
    size_t bufsize, nbits;
    mbedtls_mpi_uint ei, mm, state;
    mbedtls_mpi RR, T, W[ 2 << MBEDTLS_MPI_WINDOW_SIZE ], Apos;
    int neg;

    if( mbedtls_mpi_cmp_int( N, 0 ) <= 0 || ( N->p[0] & 1 ) == 0 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    if( mbedtls_mpi_cmp_int( E, 0 ) < 0 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    /*
     * Init temps and window size
     */
    mpi_montg_init( &mm, N );
    mbedtls_mpi_init( &RR ); mbedtls_mpi_init( &T );
    mbedtls_mpi_init( &Apos );
    memset( W, 0, sizeof( W ) );

    i = mbedtls_mpi_bitlen( E );

    wsize = ( i > 671 ) ? 6 : ( i > 239 ) ? 5 :
            ( i >  79 ) ? 4 : ( i >  23 ) ? 3 : 1;

    if( wsize > MBEDTLS_MPI_WINDOW_SIZE )
        wsize = MBEDTLS_MPI_WINDOW_SIZE;

    j = N->n + 1;
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, j ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &W[1],  j ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &T, j * 2 ) );

    /*
     * Compensate for negative A (and correct at the end)
     */
    neg = ( A->s == -1 );
    if( neg )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Apos, A ) );
        Apos.s = 1;
        A = &Apos;
    }

    /*
     * If 1st call, pre-compute R^2 mod N
     */
    if( _RR == NULL || _RR->p == NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &RR, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &RR, N->n * 2 * biL ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &RR, &RR, N ) );

        if( _RR != NULL )
            memcpy( _RR, &RR, sizeof( mbedtls_mpi ) );
    }
    else
        memcpy( &RR, _RR, sizeof( mbedtls_mpi ) );

    /*
     * W[1] = A * R^2 * R^-1 mod N = A * R mod N
     */
    if( mbedtls_mpi_cmp_mpi( A, N ) >= 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &W[1], A, N ) );
    else
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &W[1], A ) );

    MBEDTLS_MPI_CHK( mpi_montmul( &W[1], &RR, N, mm, &T ) );

    /*
     * X = R^2 * R^-1 mod N = R mod N
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, &RR ) );
    MBEDTLS_MPI_CHK( mpi_montred( X, N, mm, &T ) );

    if( wsize > 1 )
    {
        /*
         * W[1 << (wsize - 1)] = W[1] ^ (wsize - 1)
         */
        j =  one << ( wsize - 1 );

        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &W[j], N->n + 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &W[j], &W[1]    ) );

        for( i = 0; i < wsize - 1; i++ )
            MBEDTLS_MPI_CHK( mpi_montmul( &W[j], &W[j], N, mm, &T ) );

        /*
         * W[i] = W[i - 1] * W[1]
         */
        for( i = j + 1; i < ( one << wsize ); i++ )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &W[i], N->n + 1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &W[i], &W[i - 1] ) );

            MBEDTLS_MPI_CHK( mpi_montmul( &W[i], &W[1], N, mm, &T ) );
        }
    }

    nblimbs = E->n;
    bufsize = 0;
    nbits   = 0;
    wbits   = 0;
    state   = 0;

    while( 1 )
    {
        if( bufsize == 0 )
        {
            if( nblimbs == 0 )
                break;

            nblimbs--;

            bufsize = sizeof( mbedtls_mpi_uint ) << 3;
        }

        bufsize--;

        ei = (E->p[nblimbs] >> bufsize) & 1;

        /*
         * skip leading 0s
         */
        if( ei == 0 && state == 0 )
            continue;

        if( ei == 0 && state == 1 )
        {
            /*
             * out of window, square X
             */
            MBEDTLS_MPI_CHK( mpi_montmul( X, X, N, mm, &T ) );
            continue;
        }

        /*
         * add ei to current window
         */
        state = 2;

        nbits++;
        wbits |= ( ei << ( wsize - nbits ) );

        if( nbits == wsize )
        {
            /*
             * X = X^wsize R^-1 mod N
             */
            for( i = 0; i < wsize; i++ )
                MBEDTLS_MPI_CHK( mpi_montmul( X, X, N, mm, &T ) );

            /*
             * X = X * W[wbits] R^-1 mod N
             */
            MBEDTLS_MPI_CHK( mpi_montmul( X, &W[wbits], N, mm, &T ) );

            state--;
            nbits = 0;
            wbits = 0;
        }
    }

    /*
     * process the remaining bits
     */
    for( i = 0; i < nbits; i++ )
    {
        MBEDTLS_MPI_CHK( mpi_montmul( X, X, N, mm, &T ) );

        wbits <<= 1;

        if( ( wbits & ( one << wsize ) ) != 0 )
            MBEDTLS_MPI_CHK( mpi_montmul( X, &W[1], N, mm, &T ) );
    }

    /*
     * X = A^E * R * R^-1 mod N = A^E mod N
     */
    MBEDTLS_MPI_CHK( mpi_montred( X, N, mm, &T ) );

    if( neg && E->n != 0 && ( E->p[0] & 1 ) != 0 )
    {
        X->s = -1;
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( X, N, X ) );
    }

cleanup:

    for( i = ( one << ( wsize - 1 ) ); i < ( one << wsize ); i++ )
        mbedtls_mpi_free( &W[i] );

    mbedtls_mpi_free( &W[1] ); mbedtls_mpi_free( &T ); mbedtls_mpi_free( &Apos );

    if( _RR == NULL || _RR->p == NULL )
        mbedtls_mpi_free( &RR );

    return( ret );
}